

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O2

Sum_t * __thiscall Potassco::RuleBuilder::sum(Sum_t *__return_storage_ptr__,RuleBuilder *this)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Weight_t WVar4;
  WeightLit_t *pWVar5;
  
  pvVar3 = (this->mem_).beg_;
  pWVar5 = (WeightLit_t *)
           MemoryRegion::operator[](&this->mem_,(ulong)(*(uint *)((long)pvVar3 + 0xc) & 0x3fffffff))
  ;
  iVar1 = *(int *)((long)pvVar3 + 0x10);
  uVar2 = *(uint *)((long)pvVar3 + 0xc);
  (__return_storage_ptr__->lits).first = pWVar5;
  (__return_storage_ptr__->lits).size = (ulong)(iVar1 - (uVar2 & 0x3fffffff) >> 3);
  WVar4 = bound(this);
  __return_storage_ptr__->bound = WVar4;
  return __return_storage_ptr__;
}

Assistant:

Sum_t        RuleBuilder::sum()        const { Sum_t r = {span_cast<WeightLit_t>(mem_, rule_()->body), bound()}; return r; }